

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeReader.cpp
# Opt level: O0

OpCode __thiscall Js::ByteCodeReader::ReadOp(ByteCodeReader *this,byte **ip,LayoutSize *layoutSize)

{
  byte *pbVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  OpCode op;
  LayoutSize *layoutSize_local;
  byte **ip_local;
  ByteCodeReader *this_local;
  
  if (this->m_endLocation <= *ip) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0x4f,"(ip < m_endLocation)","ip < m_endLocation");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pbVar1 = *ip;
  *ip = pbVar1 + 1;
  this_local._6_2_ = (OpCode)*pbVar1;
  bVar3 = OpCodeUtil::IsPrefixOpcode(this_local._6_2_);
  if (bVar3) {
    this_local._6_2_ = ReadPrefixedOp(this,ip,layoutSize,this_local._6_2_);
  }
  else {
    *layoutSize = SmallLayout;
  }
  return this_local._6_2_;
}

Assistant:

OpCode ByteCodeReader::ReadOp(const byte *&ip, LayoutSize& layoutSize) const
    {
        // Return current location and advance past data.

        Assert(ip < m_endLocation);
        OpCode op = (OpCode)*ip++;

        if (!OpCodeUtil::IsPrefixOpcode(op))
        {
            layoutSize = SmallLayout;
            return op;
        }

        return ReadPrefixedOp(ip, layoutSize, op);
    }